

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::RunContext::handleIncomplete(RunContext *this,AssertionInfo *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  size_t sVar4;
  AssertionResultData data;
  AssertionResult assertionResult;
  AssertionResultData local_118;
  AssertionResult local_c0;
  
  pcVar3 = (this->m_lastAssertionInfo).macroName.m_data;
  if (pcVar3 != (char *)0x0) {
    operator_delete__(pcVar3);
  }
  (this->m_lastAssertionInfo).macroName.m_data = (char *)0x0;
  (this->m_lastAssertionInfo).macroName.m_start = (info->macroName).m_start;
  (this->m_lastAssertionInfo).macroName.m_size = (info->macroName).m_size;
  sVar4 = (info->lineInfo).line;
  (this->m_lastAssertionInfo).lineInfo.file = (info->lineInfo).file;
  (this->m_lastAssertionInfo).lineInfo.line = sVar4;
  pcVar3 = (this->m_lastAssertionInfo).capturedExpression.m_data;
  if (pcVar3 != (char *)0x0) {
    operator_delete__(pcVar3);
  }
  (this->m_lastAssertionInfo).capturedExpression.m_data = (char *)0x0;
  (this->m_lastAssertionInfo).capturedExpression.m_start = (info->capturedExpression).m_start;
  (this->m_lastAssertionInfo).capturedExpression.m_size = (info->capturedExpression).m_size;
  (this->m_lastAssertionInfo).resultDisposition = info->resultDisposition;
  paVar1 = &local_118.message.field_2;
  local_118.message._M_string_length = 0;
  local_118.message.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_118.reconstructedExpression.field_2;
  local_118.reconstructedExpression._M_string_length = 0;
  local_118.reconstructedExpression.field_2._M_local_buf[0] = '\0';
  local_118.lazyExpression.m_transientExpression = (ITransientExpression *)0x0;
  local_118.lazyExpression.m_isNegated = false;
  local_118.resultType = ThrewException;
  local_118.message._M_dataplus._M_p = (pointer)paVar1;
  local_118.reconstructedExpression._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_replace((ulong)&local_118,0,(char *)0x0,0x16cee6);
  AssertionResult::AssertionResult(&local_c0,info,&local_118);
  assertionEnded(this,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.m_resultData.reconstructedExpression._M_dataplus._M_p !=
      &local_c0.m_resultData.reconstructedExpression.field_2) {
    operator_delete(local_c0.m_resultData.reconstructedExpression._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.m_resultData.message._M_dataplus._M_p != &local_c0.m_resultData.message.field_2) {
    operator_delete(local_c0.m_resultData.message._M_dataplus._M_p);
  }
  if (local_c0.m_info.capturedExpression.m_data != (char *)0x0) {
    operator_delete__(local_c0.m_info.capturedExpression.m_data);
  }
  if (local_c0.m_info.macroName.m_data != (char *)0x0) {
    operator_delete__(local_c0.m_info.macroName.m_data);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.reconstructedExpression._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.reconstructedExpression._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.message._M_dataplus._M_p != paVar1) {
    operator_delete(local_118.message._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RunContext::handleIncomplete(
            AssertionInfo const& info
    ) {
        m_lastAssertionInfo = info;

        AssertionResultData data( ResultWas::ThrewException, LazyExpression( false ) );
        data.message = "Exception translation was disabled by CATCH_CONFIG_FAST_COMPILE";
        AssertionResult assertionResult{ info, data };
        assertionEnded( assertionResult );
    }